

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uchar * cJSON_strdup(uchar *string,internal_hooks *hooks)

{
  size_t sVar1;
  uchar *copy;
  size_t length;
  internal_hooks *hooks_local;
  uchar *string_local;
  
  if (string == (uchar *)0x0) {
    string_local = (uchar *)0x0;
  }
  else {
    sVar1 = strlen((char *)string);
    string_local = (uchar *)(*hooks->allocate)(sVar1 + 1);
    if (string_local == (uchar *)0x0) {
      string_local = (uchar *)0x0;
    }
    else {
      memcpy(string_local,string,sVar1 + 1);
    }
  }
  return string_local;
}

Assistant:

static unsigned char* cJSON_strdup(const unsigned char* string, const internal_hooks * const hooks)
{
    size_t length = 0;
    unsigned char *copy = NULL;

    if (string == NULL)
    {
        return NULL;
    }

    length = strlen((const char*)string) + sizeof("");
    copy = (unsigned char*)hooks->allocate(length);
    if (copy == NULL)
    {
        return NULL;
    }
    memcpy(copy, string, length);

    return copy;
}